

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

bool __thiscall Parser::IsCurBlockInLoop(Parser *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  anon_union_8_2_ecfd7102_for_StmtNest_0 aVar6;
  ulong uVar7;
  anon_union_8_2_ecfd7102_for_StmtNest_0 aVar8;
  StmtNest *pSVar9;
  
  pSVar9 = this->m_pstmtCur;
  if (pSVar9 == (StmtNest *)0x0) {
    bVar3 = false;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      aVar6 = *(anon_union_8_2_ecfd7102_for_StmtNest_0 *)&(pSVar9->field_0).field_1;
      uVar7 = (ulong)aVar6 & 0xffffffff;
      if (aVar6 == (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0 && ((ulong)pSVar9->field_0 & 1) == 0)
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.h"
                           ,0x65,"(isDeferred || pnodeStmt != nullptr)",
                           "isDeferred || pnodeStmt != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        uVar7 = (ulong)*(byte *)&pSVar9->field_0;
        aVar6 = pSVar9->field_0;
      }
      aVar8 = (anon_union_8_2_ecfd7102_for_StmtNest_0)&(pSVar9->field_0).field_1.op;
      if ((uVar7 & 1) == 0) {
        aVar8 = aVar6;
      }
      bVar1 = *(byte *)aVar8;
      uVar4 = ParseNode::Grfnop((uint)bVar1);
      bVar3 = (bool)((byte)uVar4 >> 7);
    } while (((-1 < (char)(byte)uVar4) && (bVar1 != 0x55)) &&
            (pSVar9 = pSVar9->pstmtOuter, pSVar9 != (StmtNest *)0x0));
  }
  return bVar3;
}

Assistant:

bool Parser::IsCurBlockInLoop() const
{
    for (StmtNest *stmt = this->m_pstmtCur; stmt != nullptr; stmt = stmt->pstmtOuter)
    {
        OpCode nop = stmt->GetNop();
        if (ParseNode::Grfnop(nop) & fnopContinue)
        {
            return true;
        }
        if (nop == knopFncDecl)
        {
            return false;
        }
    }
    return false;
}